

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::throwErrorIfNotReadableType(Expression *e)

{
  bool bVar1;
  int iVar2;
  Context *this;
  CompileMessage local_80;
  CompileMessage local_48;
  
  if (e->kind == type) {
    iVar2 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[3])(e);
    if ((char)iVar2 != '\0') {
      return;
    }
  }
  bVar1 = is_type<soul::AST::ProcessorRef,soul::AST::Expression>(e);
  this = &(e->super_Statement).super_ASTObject.context;
  if (bVar1) {
    Errors::cannotUseProcessorAsType<>();
    AST::Context::throwError(this,&local_48,false);
  }
  Errors::expectedType<>();
  AST::Context::throwError(this,&local_80,false);
}

Assistant:

static void throwErrorIfNotReadableType (AST::Expression& e)
    {
        if (! AST::isResolvedAsType (e))
        {
            if (is_type<AST::ProcessorRef> (e))
                e.context.throwError (Errors::cannotUseProcessorAsType());

            e.context.throwError (Errors::expectedType());
        }
    }